

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

int constructSubscibeTypeVariableHeader(BUFFER_HANDLE ctrlPacket,uint16_t packetId)

{
  int iVar1;
  int iVar2;
  ushort *puVar3;
  
  iVar1 = BUFFER_enlarge(ctrlPacket,2);
  iVar2 = 0x11f;
  if (iVar1 == 0) {
    puVar3 = (ushort *)BUFFER_u_char(ctrlPacket);
    if (puVar3 == (ushort *)0x0) {
      iVar2 = 0x126;
    }
    else {
      *puVar3 = packetId << 8 | packetId >> 8;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int constructSubscibeTypeVariableHeader(BUFFER_HANDLE ctrlPacket, uint16_t packetId)
{
    int result = 0;
    if (BUFFER_enlarge(ctrlPacket, 2) != 0)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* iterator = BUFFER_u_char(ctrlPacket);
        if (iterator == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            byteutil_writeInt(&iterator, packetId);
            result = 0;
        }
    }
    return result;
}